

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O3

void __thiscall QFileSystemTreeView::setVisibleSections(QFileSystemTreeView *this,Sections sections)

{
  bool bVar1;
  int iVar2;
  
  if (sections.i == 0) {
    iVar2 = QTreeView::header();
    QHeaderView::setSectionHidden(iVar2,false);
    iVar2 = QTreeView::header();
    QHeaderView::setSectionHidden(iVar2,true);
    iVar2 = QTreeView::header();
    QHeaderView::setSectionHidden(iVar2,true);
  }
  else {
    iVar2 = QTreeView::header();
    QHeaderView::setSectionHidden(iVar2,false);
    iVar2 = QTreeView::header();
    QHeaderView::setSectionHidden(iVar2,true);
    iVar2 = QTreeView::header();
    QHeaderView::setSectionHidden(iVar2,true);
  }
  iVar2 = QTreeView::header();
  QHeaderView::setSectionHidden(iVar2,true);
  bVar1 = (bool)QTreeView::header();
  iVar2 = QTreeView::header();
  QHeaderView::isSectionHidden(iVar2);
  QHeaderView::setStretchLastSection(bVar1);
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  iVar2 = QTreeView::header();
  QHeaderView::resizeSection(iVar2,0);
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  iVar2 = QTreeView::header();
  QHeaderView::resizeSection(iVar2,1);
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  iVar2 = QTreeView::header();
  QHeaderView::resizeSection(iVar2,2);
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  iVar2 = QTreeView::header();
  QHeaderView::resizeSection(iVar2,3);
  return;
}

Assistant:

void QFileSystemTreeView::setVisibleSections(QFileSystemTreeView::Sections sections) {
    const auto isSectionHidden = [this](QFileSystemTreeView::Column column) {
        return header()->isSectionHidden(static_cast<int>(column));
    };
    const auto setSectionHidden = [this](QFileSystemTreeView::Column column, bool hidden) {
        header()->setSectionHidden(static_cast<int>(column), hidden);
    };
    const auto resizeSection = [this](QFileSystemTreeView::Column column, int size) {
        header()->resizeSection(static_cast<int>(column), size);
    };

    if (sections == Sections(QFileSystemTreeView::Section::All)) {
        setSectionHidden(QFileSystemTreeView::Column::Name, false);
        setSectionHidden(QFileSystemTreeView::Column::Size, false);
        setSectionHidden(QFileSystemTreeView::Column::Type, false);
        setSectionHidden(QFileSystemTreeView::Column::LastModification, false);
    } else {
        setSectionHidden(QFileSystemTreeView::Column::Name, !sections.testFlag(QFileSystemTreeView::Section::Name));
        setSectionHidden(QFileSystemTreeView::Column::Size, !sections.testFlag(QFileSystemTreeView::Section::Size));
        setSectionHidden(QFileSystemTreeView::Column::Type, !sections.testFlag(QFileSystemTreeView::Section::Type));
        setSectionHidden(QFileSystemTreeView::Column::LastModification,
                         !sections.testFlag(QFileSystemTreeView::Section::LastModification));
    }

    header()->setStretchLastSection(isSectionHidden(QFileSystemTreeView::Column::Name));
    resizeSection(QFileSystemTreeView::Column::Name, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::Size, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::Type, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::LastModification, header()->defaultSectionSize());
}